

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void render(size_t *width,size_t *height,
           vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *buffer,float interocular)

{
  size_t sVar1;
  pointer pVVar2;
  Scene *this;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  size_t left_width;
  size_t right_width;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> right_buffer;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> left_buffer;
  allocator_type local_99;
  Scene *local_98;
  float local_8c;
  ulong local_88;
  size_t local_80;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> local_78;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_98 = (Scene *)CONCAT44(local_98._4_4_,interocular);
  this = setup_scene();
  if ((local_98._0_4_ != 0.0) || (NAN(local_98._0_4_))) {
    local_88 = *width >> 1;
    local_80 = *width - local_88;
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              (&local_60,local_88 * *height,(allocator_type *)&local_78);
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              (&local_78,*height * local_88,&local_99);
    fVar9 = local_98._0_4_ * 0.5;
    local_48._0_4_ = (this->camera).position.x;
    local_48._4_4_ = (this->camera).position.y;
    local_8c = (this->camera).position.z;
    local_98 = (Scene *)CONCAT44(local_98._4_4_,fVar9);
    uStack_40 = 0;
    (this->camera).position.x = fVar9 + (float)local_48;
    (this->camera).position.y = (float)local_48._4_4_ + 0.0;
    (this->camera).position.z = local_8c + 0.0;
    Scene::render(this,&local_88,height,&local_60);
    (this->camera).position.x = (float)local_48 - local_98._0_4_;
    (this->camera).position.y = (float)local_48._4_4_;
    (this->camera).position.z = local_8c;
    Scene::render(this,&local_80,height,&local_78);
    (this->camera).position.x = (float)local_48;
    (this->camera).position.y = (float)local_48._4_4_;
    (this->camera).position.z = local_8c;
    if (*height != 0) {
      lVar3 = 0;
      lVar4 = 0;
      uVar6 = 0;
      do {
        if (local_88 != 0) {
          lVar7 = 0;
          uVar8 = local_88;
          do {
            sVar1 = *width;
            pVVar2 = (buffer->super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            *(undefined4 *)((long)&pVVar2->z + lVar7 + sVar1 * lVar3) =
                 *(undefined4 *)
                  ((long)&(local_60.
                           super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start)->z + lVar7 + lVar4);
            *(undefined8 *)((long)&pVVar2->x + lVar7 + sVar1 * lVar3) =
                 *(undefined8 *)
                  ((long)&(local_60.
                           super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start)->x + lVar7 + lVar4);
            lVar7 = lVar7 + 0xc;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + local_88 * 0xc;
        lVar3 = lVar3 + 0xc;
      } while (uVar6 < *height);
    }
    if (*height != 0) {
      lVar5 = 0;
      lVar3 = 0;
      uVar8 = 0;
      lVar4 = local_88 * 0xc;
      uVar6 = local_88;
      lVar7 = lVar3;
      do {
        for (; uVar6 != 0; uVar6 = uVar6 - 1) {
          sVar1 = *width;
          pVVar2 = (buffer->super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          *(undefined4 *)((long)&pVVar2->z + lVar4 + sVar1 * lVar5) =
               *(undefined4 *)
                ((long)&(local_78.
                         super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->z + lVar3);
          *(undefined8 *)((long)&pVVar2->x + lVar4 + sVar1 * lVar5) =
               *(undefined8 *)
                ((long)&(local_78.
                         super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->x + lVar3);
          lVar3 = lVar3 + 0xc;
          lVar4 = lVar4 + 0xc;
        }
        uVar8 = uVar8 + 1;
        lVar3 = lVar7 + local_80 * 0xc;
        lVar5 = lVar5 + 0xc;
        lVar4 = local_88 * 0xc;
        uVar6 = local_88;
        lVar7 = lVar3;
      } while (uVar8 < *height);
    }
    local_98 = this;
    if (local_78.super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    this = local_98;
    if (local_60.super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    Scene::render(this,width,height,buffer);
  }
  Scene::~Scene(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

void render(const size_t &width, const size_t &height, std::vector<Vec3f> &buffer, const float interocular = 0) {
    Scene *scene = setup_scene();

    // Render a side-by-side 3d rendering if the interocular distance is nonzero.
    if (interocular == 0) {
        scene->render(width, height, buffer);
    } else {
        // Use two buffers in case of odd resolutions.
        const size_t left_width = width / 2;
        const size_t right_width = width - left_width;
        std::vector<Vec3f> left_buffer(left_width * height);
        std::vector<Vec3f> right_buffer(left_width * height);

        Vec3f eye_transformation(interocular / 2, 0, 0);
        Pos3f orig_cam_pos = scene->camera.position;

        // Render the left eye.
        scene->camera.position = orig_cam_pos + eye_transformation;
        scene->render(left_width, height, left_buffer);

        // Now the right.
        scene->camera.position = orig_cam_pos - eye_transformation;
        scene->render(right_width, height, right_buffer);

        // Don't forget to reset the camera position.
        scene->camera.position = orig_cam_pos;

        // Stitch the views together into the output buffer.
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + j * width] = left_buffer[i + j * left_width];
            }
        }
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + left_width + j * width] = right_buffer[i + j * right_width];
            }
        }
    }

    delete scene;
}